

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode::ByteSizeLong
          (TreeEnsembleParameters_TreeNode *this)

{
  uint uVar1;
  long lVar2;
  Type *value;
  size_t sVar3;
  ulong uVar4;
  uint i;
  uint index;
  size_t sVar5;
  
  uVar1 = (this->evaluationinfo_).super_RepeatedPtrFieldBase.current_size_;
  sVar5 = (ulong)uVar1 * 2;
  for (index = 0; uVar1 != index; index = index + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>::TypeHandler>
                      (&(this->evaluationinfo_).super_RepeatedPtrFieldBase,index);
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>
                      (value);
    sVar5 = sVar5 + sVar3;
  }
  if (this->treeid_ != 0) {
    uVar4 = this->treeid_ | 1;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (this->nodeid_ != 0) {
    uVar4 = this->nodeid_ | 1;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (this->nodebehavior_ != 0) {
    sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->nodebehavior_);
    sVar5 = sVar5 + sVar3 + 1;
  }
  sVar3 = sVar5 + 2;
  if (this->missingvaluetrackstruechild_ == false) {
    sVar3 = sVar5;
  }
  if (this->branchfeatureindex_ != 0) {
    uVar4 = this->branchfeatureindex_ | 1;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
  }
  sVar5 = sVar3;
  if (this->branchfeaturevalue_ != 0.0) {
    sVar5 = sVar3 + 9;
  }
  if (NAN(this->branchfeaturevalue_)) {
    sVar5 = sVar3 + 9;
  }
  if (this->truechildnodeid_ != 0) {
    uVar4 = this->truechildnodeid_ | 1;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (this->falsechildnodeid_ != 0) {
    uVar4 = this->falsechildnodeid_ | 1;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
  }
  sVar3 = sVar5;
  if (this->relativehitrate_ != 0.0) {
    sVar3 = sVar5 + 10;
  }
  if (NAN(this->relativehitrate_)) {
    sVar3 = sVar5 + 10;
  }
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

size_t TreeEnsembleParameters_TreeNode::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.TreeEnsembleParameters.TreeNode)
  size_t total_size = 0;

  // repeated .CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo evaluationInfo = 20;
  {
    unsigned int count = this->evaluationinfo_size();
    total_size += 2UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->evaluationinfo(i));
    }
  }

  // uint64 treeId = 1;
  if (this->treeid() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->treeid());
  }

  // uint64 nodeId = 2;
  if (this->nodeid() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->nodeid());
  }

  // .CoreML.Specification.TreeEnsembleParameters.TreeNode.TreeNodeBehavior nodeBehavior = 3;
  if (this->nodebehavior() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->nodebehavior());
  }

  // bool missingValueTracksTrueChild = 14;
  if (this->missingvaluetrackstruechild() != 0) {
    total_size += 1 + 1;
  }

  // uint64 branchFeatureIndex = 10;
  if (this->branchfeatureindex() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->branchfeatureindex());
  }

  // double branchFeatureValue = 11;
  if (this->branchfeaturevalue() != 0) {
    total_size += 1 + 8;
  }

  // uint64 trueChildNodeId = 12;
  if (this->truechildnodeid() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->truechildnodeid());
  }

  // uint64 falseChildNodeId = 13;
  if (this->falsechildnodeid() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->falsechildnodeid());
  }

  // double relativeHitRate = 30;
  if (this->relativehitrate() != 0) {
    total_size += 2 + 8;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}